

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O1

BayesianProbitRegressor_FeatureWeight * __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureWeight::New
          (BayesianProbitRegressor_FeatureWeight *this,Arena *arena)

{
  BayesianProbitRegressor_FeatureWeight *this_00;
  
  this_00 = (BayesianProbitRegressor_FeatureWeight *)operator_new(0x30);
  BayesianProbitRegressor_FeatureWeight(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

BayesianProbitRegressor_FeatureWeight* BayesianProbitRegressor_FeatureWeight::New(::google::protobuf::Arena* arena) const {
  BayesianProbitRegressor_FeatureWeight* n = new BayesianProbitRegressor_FeatureWeight;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}